

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

StackNode *
stack_node_new(StackNode *previous_node,Subtree subtree,_Bool is_pending,TSStateId state,
              StackNodeArray *pool)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  StackNode *pSVar6;
  Length LVar7;
  
  if (pool->size == 0) {
    pSVar6 = (StackNode *)ts_malloc(0xe8);
  }
  else {
    uVar3 = pool->size - 1;
    pool->size = uVar3;
    pSVar6 = pool->contents[uVar3];
  }
  pSVar6->state = state;
  memset(&pSVar6->field_0x2,0,0xd2);
  pSVar6->ref_count = 1;
  pSVar6->error_cost = 0;
  pSVar6->node_count = 0;
  *(undefined8 *)&pSVar6->dynamic_precedence = 0;
  if (previous_node == (StackNode *)0x0) {
    (pSVar6->position).extent.column = 0;
  }
  else {
    pSVar6->link_count = 1;
    pSVar6->links[0].node = previous_node;
    pSVar6->links[0].subtree = subtree;
    pSVar6->links[0].is_pending = is_pending;
    uVar4 = (previous_node->position).extent.row;
    (pSVar6->position).bytes = (previous_node->position).bytes;
    (pSVar6->position).extent.row = uVar4;
    (pSVar6->position).extent.column = (previous_node->position).extent.column;
    uVar3 = previous_node->error_cost;
    pSVar6->error_cost = uVar3;
    iVar1 = previous_node->dynamic_precedence;
    pSVar6->dynamic_precedence = iVar1;
    uVar2 = previous_node->node_count;
    pSVar6->node_count = uVar2;
    if (subtree.ptr != (SubtreeHeapData *)0x0) {
      uVar4 = ts_subtree_error_cost(subtree);
      pSVar6->error_cost = uVar4 + uVar3;
      LVar7 = ts_subtree_total_size(subtree);
      LVar7 = length_add(pSVar6->position,LVar7);
      pSVar6->position = LVar7;
      if ((((ulong)subtree.ptr & 1) == 0) && ((subtree.ptr)->child_count != 0)) {
        pSVar6->node_count = uVar2 + ((subtree.ptr)->field_17).field_0.node_count;
        iVar5 = ((subtree.ptr)->field_17).field_0.dynamic_precedence;
      }
      else {
        pSVar6->node_count = uVar2 + 1;
        iVar5 = 0;
      }
      pSVar6->dynamic_precedence = iVar5 + iVar1;
    }
  }
  return pSVar6;
}

Assistant:

static StackNode *stack_node_new(StackNode *previous_node, Subtree subtree,
                                 bool is_pending, TSStateId state, StackNodeArray *pool) {
  StackNode *node = pool->size > 0 ?
    array_pop(pool) :
    ts_malloc(sizeof(StackNode));
  *node = (StackNode){.ref_count = 1, .link_count = 0, .state = state};

  if (previous_node) {
    node->link_count = 1;
    node->links[0] = (StackLink){
      .node = previous_node,
      .subtree = subtree,
      .is_pending = is_pending,
    };

    node->position = previous_node->position;
    node->error_cost = previous_node->error_cost;
    node->dynamic_precedence = previous_node->dynamic_precedence;
    node->node_count = previous_node->node_count;

    if (subtree.ptr) {
      node->error_cost += ts_subtree_error_cost(subtree);
      node->position = length_add(node->position, ts_subtree_total_size(subtree));
      node->node_count += ts_subtree_node_count(subtree);
      node->dynamic_precedence += ts_subtree_dynamic_precedence(subtree);
    }
  } else {
    node->position = length_zero();
    node->error_cost = 0;
  }

  return node;
}